

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
          (sysbvm_context_t *context,char *symbolString,sysbvm_tuple_t ownerClass,
          char *selectorString,size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *puStack_40;
  
  puStack_40 = (undefined1 *)&local_78;
  local_68 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 4;
  sStack_60 = ownerClass;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_68 = sysbvm_function_createPrimitive(context,argumentCount,flags,userdata,entryPoint);
  if (selectorString != (char *)0x0) {
    sStack_70 = sysbvm_symbol_internWithCString(context,selectorString);
    sysbvm_type_setMethodWithSelector(context,sStack_60,sStack_70,local_68);
  }
  if (symbolString != (char *)0x0) {
    local_78 = sysbvm_symbol_internWithCString(context,symbolString);
    sysbvm_namespace_setNewSymbolBindingWithValue
              (context,(context->roots).globalNamespace,local_78,local_68);
  }
  sysbvm_stackFrame_popRecord(&local_58);
  return local_68;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(sysbvm_context_t *context, const char *symbolString, sysbvm_tuple_t ownerClass, const char *selectorString, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    struct {
        sysbvm_tuple_t symbol;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t primitiveFunction;
        sysbvm_tuple_t ownerClass;
    } gcFrame = {
        .ownerClass = ownerClass
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.primitiveFunction = sysbvm_function_createPrimitive(context, argumentCount, flags, userdata, entryPoint);
    if(selectorString)
    {
        gcFrame.selector = sysbvm_symbol_internWithCString(context, selectorString);
        sysbvm_type_setMethodWithSelector(context, gcFrame.ownerClass, gcFrame.selector, gcFrame.primitiveFunction);
    }

    if(symbolString)
    {
        gcFrame.symbol = sysbvm_symbol_internWithCString(context, symbolString);
        sysbvm_context_setIntrinsicSymbolBindingValue(context, gcFrame.symbol, gcFrame.primitiveFunction);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.primitiveFunction;
}